

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_ctor_array(void)

{
  bool bVar1;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::empty
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x79,"void api_dynamic_suite::dynamic_ctor_array()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::full
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7a,"void api_dynamic_suite::dynamic_ctor_array()",(bool)(bVar1 - 1U & 1));
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7b,"void api_dynamic_suite::dynamic_ctor_array()",local_48,&local_4c);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::capacity
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7c,"void api_dynamic_suite::dynamic_ctor_array()",&local_58,&local_5c);
  return;
}

Assistant:

void dynamic_ctor_array()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
}